

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O1

uint __thiscall Network::compute_triangles(Network *this,uint node_i)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  pointer psVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  iterator __begin2;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  uint uVar9;
  _Rb_tree_header *p_Var10;
  iterator __end2;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  
  psVar3 = (this->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var11 = &psVar3[node_i]._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = *(_Base_ptr *)((long)&psVar3[node_i]._M_t._M_impl.super__Rb_tree_header + 0x10);
  uVar9 = 0;
  p_Var7 = p_Var4;
  if (p_Var4 != p_Var11) {
    do {
      _Var1 = p_Var7[1]._M_color;
      p_Var12 = &psVar3[_Var1]._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = p_Var4;
      do {
        _Var2 = p_Var6[1]._M_color;
        if (_Var2 != _Var1) {
          p_Var5 = *(_Base_ptr *)((long)&psVar3[_Var1]._M_t._M_impl.super__Rb_tree_header + 8);
          p_Var8 = &p_Var12->_M_header;
          for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
              p_Var5 = (&p_Var5->_M_left)[bVar13]) {
            bVar13 = (_Rb_tree_color)*(size_t *)(p_Var5 + 1) < _Var2;
            if (!bVar13) {
              p_Var8 = p_Var5;
            }
          }
          p_Var10 = p_Var12;
          if (((_Rb_tree_header *)p_Var8 != p_Var12) &&
             (p_Var10 = (_Rb_tree_header *)p_Var8,
             _Var2 < (_Rb_tree_color)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
            p_Var10 = p_Var12;
          }
          uVar9 = uVar9 + (p_Var10 != p_Var12);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var11);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var11);
    uVar9 = uVar9 >> 1;
  }
  return uVar9;
}

Assistant:

unsigned int compute_triangles(unsigned int node_i) const {
        unsigned int triangles = 0;
        for (unsigned int node_j : links[node_i])
            for (unsigned int node_k : links[node_i])
                if (node_k != node_j and links[node_j].count(node_k))
                    triangles++;
        return triangles/2;
    }